

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::getNextStart
          (TimeArrayTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  TimeRuleType TVar1;
  uint uVar2;
  UDate *pUVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  
  TVar1 = this->fTimeRuleType;
  uVar2 = this->fNumStartTimes;
  pUVar3 = this->fStartTimes;
  for (uVar6 = (ulong)uVar2; uVar5 = (uint)uVar6, uVar4 = (int)uVar2 >> 0x1f & uVar2, 0 < (int)uVar5
      ; uVar6 = uVar6 - 1) {
    dVar7 = pUVar3[uVar6 - 1];
    if (TVar1 != UTC_TIME) {
      dVar7 = dVar7 - (double)prevRawOffset;
    }
    if (TVar1 == WALL_TIME) {
      dVar7 = dVar7 - (double)prevDSTSavings;
    }
    uVar4 = uVar5;
    if ((dVar7 < base) || (inclusive == '\0' && dVar7 == base)) break;
    *result = dVar7;
  }
  return uVar4 != uVar2;
}

Assistant:

UBool
TimeArrayTimeZoneRule::getNextStart(UDate base,
                                    int32_t prevRawOffset,
                                    int32_t prevDSTSavings,
                                    UBool inclusive,
                                    UDate& result) const {
    int32_t i = fNumStartTimes - 1;
    for (; i >= 0; i--) {
        UDate time = getUTC(fStartTimes[i], prevRawOffset, prevDSTSavings);
        if (time < base || (!inclusive && time == base)) {
            break;
        }
        result = time;
    }
    if (i == fNumStartTimes - 1) {
        return FALSE;
    }
    return TRUE;
}